

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SslCtx.cpp
# Opt level: O2

bool __thiscall
axl::io::SslCtx::loadVerifyLocations(SslCtx *this,StringRef *caFileName,StringRef *caDir)

{
  SSL_CTX *ctx;
  bool bVar1;
  int iVar2;
  C *CAfile;
  C *CApath;
  
  ctx = (SSL_CTX *)
        (this->super_Handle<ssl_ctx_st_*,_axl::io::FreeSslCtx,_axl::sl::Zero<ssl_ctx_st_*>_>).m_h;
  if (caFileName->m_length == 0) {
    CAfile = (char *)0x0;
  }
  else {
    CAfile = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(caFileName);
  }
  if (caDir->m_length == 0) {
    CApath = (char *)0x0;
  }
  else {
    CApath = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(caDir);
  }
  iVar2 = SSL_CTX_load_verify_locations(ctx,CAfile,CApath);
  bVar1 = cry::completeWithLastCryptoError((uint)(0 < iVar2));
  return bVar1;
}

Assistant:

bool
SslCtx::loadVerifyLocations(
	const sl::StringRef& caFileName,
	const sl::StringRef& caDir
) {
	ASSERT(m_h);

	int result = ::SSL_CTX_load_verify_locations(
		m_h,
		!caFileName.isEmpty() ? caFileName.sz() : NULL,
		!caDir.isEmpty() ? caDir.sz() : NULL
	);

	return cry::completeWithLastCryptoError(result > 0);
}